

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed-dtoa.cc
# Opt level: O2

void double_conversion::RoundUp(Vector<char> buffer,int *length,int *decimal_point)

{
  ulong uVar1;
  uint *puVar2;
  char *pcVar3;
  
  puVar2 = buffer._8_8_;
  pcVar3 = buffer.start_;
  if ((long)(int)*puVar2 == 0) {
    *pcVar3 = '1';
    *length = 1;
    *puVar2 = 1;
    return;
  }
  pcVar3[(long)(int)*puVar2 + -1] = pcVar3[(long)(int)*puVar2 + -1] + '\x01';
  uVar1 = (ulong)*puVar2;
  while( true ) {
    if ((int)uVar1 < 2) {
      if (*pcVar3 == ':') {
        *pcVar3 = '1';
        *length = *length + 1;
      }
      return;
    }
    if (pcVar3[uVar1 - 1] != ':') break;
    pcVar3[uVar1 - 1] = '0';
    pcVar3[uVar1 - 2] = pcVar3[uVar1 - 2] + '\x01';
    uVar1 = uVar1 - 1;
  }
  return;
}

Assistant:

static void RoundUp(Vector<char> buffer, int* length, int* decimal_point) {
  // An empty buffer represents 0.
  if (*length == 0) {
    buffer[0] = '1';
    *decimal_point = 1;
    *length = 1;
    return;
  }
  // Round the last digit until we either have a digit that was not '9' or until
  // we reached the first digit.
  buffer[(*length) - 1]++;
  for (int i = (*length) - 1; i > 0; --i) {
    if (buffer[i] != '0' + 10) {
      return;
    }
    buffer[i] = '0';
    buffer[i - 1]++;
  }
  // If the first digit is now '0' + 10, we would need to set it to '0' and add
  // a '1' in front. However we reach the first digit only if all following
  // digits had been '9' before rounding up. Now all trailing digits are '0' and
  // we simply switch the first digit to '1' and update the decimal-point
  // (indicating that the point is now one digit to the right).
  if (buffer[0] == '0' + 10) {
    buffer[0] = '1';
    (*decimal_point)++;
  }
}